

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void os_banner_set_attr(void *banner_handle,int attr)

{
  int in_ESI;
  int *in_RDI;
  osgen_txtwin_t *unaff_retaddr;
  char buf [3];
  osgen_win_t *win;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_ESI != in_RDI[0x19]) && (*in_RDI == 1)) {
    ossaddsb(unaff_retaddr,(char *)in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void os_banner_set_attr(void *banner_handle, int attr)
{
    osgen_win_t *win = (osgen_win_t *)banner_handle;
    char buf[3];

    /* if the attributes aren't changing, ignore it */
    if (attr == win->txtattr)
        return;

    /* set the attribute according to the window type */
    switch(win->win_type)
    {
    case OS_BANNER_TYPE_TEXT:
        /* add the color sequence to the window's scrollback buffer */
        buf[0] = OSGEN_ATTR;
        buf[1] = (char)attr;
        ossaddsb((osgen_txtwin_t *)win, buf, 2, TRUE);
        break;

    case OS_BANNER_TYPE_TEXTGRID:
        /* text grid windows don't use attributes - ignore it */
        break;
    }
}